

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,AssertionResult *assertion_result,
          char *expression_text,char *actual_predicate_value,char *expected_predicate_value)

{
  Message *pMVar1;
  Message local_40;
  Message msg;
  char *actual_message;
  char *expected_predicate_value_local;
  char *actual_predicate_value_local;
  char *expression_text_local;
  AssertionResult *assertion_result_local;
  
  actual_message = actual_predicate_value;
  expected_predicate_value_local = expression_text;
  actual_predicate_value_local = &assertion_result->success_;
  expression_text_local = (char *)this;
  assertion_result_local = (AssertionResult *)__return_storage_ptr__;
  msg.ss_.ptr_ = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )AssertionResult::message((AssertionResult *)this);
  Message::Message(&local_40);
  pMVar1 = Message::operator<<(&local_40,(char (*) [11])"Value of: ");
  pMVar1 = Message::operator<<(pMVar1,&actual_predicate_value_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [12])"\n  Actual: ");
  Message::operator<<(pMVar1,&expected_predicate_value_local);
  if (*(char *)msg.ss_.ptr_ != '\0') {
    pMVar1 = Message::operator<<(&local_40,(char (*) [3])0x14d1fd);
    pMVar1 = Message::operator<<(pMVar1,(char **)&msg);
    Message::operator<<(pMVar1,(char (*) [2])0x14d6c6);
  }
  pMVar1 = Message::operator<<(&local_40,(char (*) [12])"\nExpected: ");
  Message::operator<<(pMVar1,&actual_message);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,&local_40);
  Message::~Message(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetBoolAssertionFailureMessage(
    const AssertionResult& assertion_result,
    const char* expression_text,
    const char* actual_predicate_value,
    const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0')
    msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}